

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_charAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  JSValue JVar2;
  uint16_t c;
  int iVar3;
  JSValueUnion JVar4;
  long lVar5;
  uint uVar6;
  JSRefCountHeader *p_2;
  uint uVar7;
  JSRefCountHeader *p_1;
  JSValue v;
  JSValue JVar8;
  int idx;
  uint local_2c;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  JVar4 = v.u;
  uVar7 = (uint)v.tag;
  JVar8 = v;
  if (uVar7 != 6) {
    JVar8 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    iVar3 = JS_ToInt32SatFree(ctx,(int *)&local_2c,JVar8);
    if (iVar3 == 0) {
      lVar5 = (long)(int)local_2c;
      if ((lVar5 < 0) ||
         (uVar6 = (uint)*(undefined8 *)((long)JVar4.ptr + 4), (uVar6 & 0x7fffffff) <= local_2c)) {
        JVar1 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
        JVar8.tag = -7;
        JVar8.u.ptr = JVar1.ptr;
      }
      else {
        if ((int)uVar6 < 0) {
          c = *(uint16_t *)((long)JVar4.ptr + lVar5 * 2 + 0x10);
        }
        else {
          c = (uint16_t)*(byte *)((long)JVar4.ptr + lVar5 + 0x10);
        }
        JVar8 = js_new_string_char(ctx,c);
      }
      if (uVar7 < 0xfffffff5) {
        return JVar8;
      }
      iVar3 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar3 + -1;
      JVar2 = JVar8;
    }
    else {
      if (uVar7 < 0xfffffff5) {
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      iVar3 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar3 + -1;
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
      JVar8 = (JSValue)(ZEXT816(6) << 0x40);
    }
    if (iVar3 < 2) {
      __JS_FreeValueRT(ctx->rt,v);
      JVar8 = JVar2;
    }
  }
  return JVar8;
}

Assistant:

static JSValue js_string_charAt(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = js_new_string8(ctx, NULL, 0);
    } else {
        if (p->is_wide_char)
            c = p->u.str16[idx];
        else
            c = p->u.str8[idx];
        ret = js_new_string_char(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}